

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execShiftEa<(moira::Instr)13,(moira::Mode)8,(moira::Size)2>(Moira *this,u16 op)

{
  bool bVar1;
  u32 in_EAX;
  u32 val;
  u32 in_register_00000004;
  u32 data;
  u32 ea;
  
  data = in_EAX;
  ea = in_register_00000004;
  bVar1 = readOp<(moira::Mode)8,(moira::Size)2,0ul>(this,op & 7,&ea,&data);
  if (bVar1) {
    prefetch<0ul>(this);
    val = shift<(moira::Instr)13,(moira::Size)2>(this,1,(ulong)data);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,ea,val);
  }
  return;
}

Assistant:

void
Moira::execShiftEa(u16 op)
{
    int src = _____________xxx(op);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    prefetch();

    writeM<M,S, POLLIPL>(ea, shift<I,S>(1, data));
}